

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepSubstring *
absl::lts_20250127::cord_internal::anon_unknown_0::CreateSubstring
          (CordRep *rep,size_t offset,size_t n)

{
  CordRepSubstring *pCVar1;
  bool bVar2;
  bool local_3e;
  CordRepSubstring *substring;
  CordRepSubstring *substring_1;
  size_t n_local;
  size_t offset_local;
  CordRep *rep_local;
  
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x76,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  if (rep->length < offset + n) {
    __assert_fail("offset + n <= rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x77,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  bVar2 = true;
  if (offset == 0) {
    bVar2 = n != rep->length;
  }
  if (!bVar2) {
    __assert_fail("offset != 0 || n != rep->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x78,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  n_local = offset;
  offset_local = (size_t)rep;
  if (rep->tag == '\x01') {
    pCVar1 = CordRep::substring(rep);
    n_local = pCVar1->start + offset;
    offset_local = (size_t)CordRep::Ref(pCVar1->child);
    CordRep::Unref(&pCVar1->super_CordRep);
  }
  bVar2 = CordRep::IsExternal((CordRep *)offset_local);
  local_3e = true;
  if (!bVar2) {
    local_3e = CordRep::IsFlat((CordRep *)offset_local);
  }
  if (local_3e == false) {
    __assert_fail("rep->IsExternal() || rep->IsFlat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x80,
                  "CordRepSubstring *absl::cord_internal::(anonymous namespace)::CreateSubstring(CordRep *, size_t, size_t)"
                 );
  }
  pCVar1 = (CordRepSubstring *)operator_new(0x20);
  pCVar1->start = 0;
  pCVar1->child = (CordRep *)0x0;
  (pCVar1->super_CordRep).length = 0;
  (pCVar1->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar1->super_CordRep).tag = '\0';
  (pCVar1->super_CordRep).storage[0] = '\0';
  (pCVar1->super_CordRep).storage[1] = '\0';
  (pCVar1->super_CordRep).storage[2] = '\0';
  CordRepSubstring::CordRepSubstring(pCVar1);
  (pCVar1->super_CordRep).length = n;
  (pCVar1->super_CordRep).tag = '\x01';
  pCVar1->start = n_local;
  pCVar1->child = (CordRep *)offset_local;
  return pCVar1;
}

Assistant:

CordRepSubstring* CreateSubstring(CordRep* rep, size_t offset, size_t n) {
  assert(n != 0);
  assert(offset + n <= rep->length);
  assert(offset != 0 || n != rep->length);

  if (rep->tag == SUBSTRING) {
    CordRepSubstring* substring = rep->substring();
    offset += substring->start;
    rep = CordRep::Ref(substring->child);
    CordRep::Unref(substring);
  }
  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = rep;
  return substring;
}